

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int buildCharField(charField *cf,bstring b1)

{
  int iVar1;
  uchar *puVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = -1;
  if (((b1 != (bstring)0x0) && (b1->data != (uchar *)0x0)) && (0 < b1->slen)) {
    cf->content[6] = 0;
    cf->content[7] = 0;
    cf->content[4] = 0;
    cf->content[5] = 0;
    cf->content[2] = 0;
    cf->content[3] = 0;
    cf->content[0] = 0;
    cf->content[1] = 0;
    iVar1 = b1->slen;
    if ((long)iVar1 < 1) {
      return 0;
    }
    puVar2 = b1->data;
    iVar3 = 0;
    lVar4 = 0;
    do {
      cf->content[puVar2[lVar4] >> 5] =
           cf->content[puVar2[lVar4] >> 5] | 1L << (puVar2[lVar4] & 0x1f);
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return iVar3;
}

Assistant:

static int buildCharField (struct charField * cf, const bstring b1) {
int i;
	if (b1 == NULL || b1->data == NULL || b1->slen <= 0) return BSTR_ERR;
	memset ((void *) cf->content, 0, sizeof (struct charField));
	for (i=0; i < b1->slen; i++) {
		unsigned int c = (unsigned int) b1->data[i];
		cf->content[c >> LONG_LOG_BITS_QTY] |= ((LONG_TYPE) 1) << (c & (LONG_BITS_QTY-1));
	}
	return 0;
}